

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::destroy_attribute(xml_attribute_struct *a,xml_allocator *alloc)

{
  ulong uVar1;
  
  uVar1 = a->header;
  if ((uVar1 & 0x20) != 0) {
    xml_allocator::deallocate_string(alloc,a->name);
    uVar1 = a->header;
  }
  if ((uVar1 & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,a->value);
    uVar1 = a->header;
  }
  xml_allocator::deallocate_memory(alloc,a,0x28,(xml_memory_page *)((long)a - (uVar1 >> 8)));
  return;
}

Assistant:

inline void destroy_attribute(xml_attribute_struct* a, xml_allocator& alloc)
	{
		if (a->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(a->name);

		if (a->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(a->value);

		alloc.deallocate_memory(a, sizeof(xml_attribute_struct), PUGI__GETPAGE(a));
	}